

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void total_changes(sqlite3_context *context,int NotUsed,sqlite3_value **NotUsed2)

{
  int iVar1;
  
  iVar1 = ((context->s).db)->nTotalChange;
  sqlite3VdbeMemRelease(&context->s);
  (context->s).u = (anon_union_8_5_44880d43_for_u)(long)iVar1;
  (context->s).flags = 4;
  (context->s).type = '\x01';
  return;
}

Assistant:

static void total_changes(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **NotUsed2
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  UNUSED_PARAMETER2(NotUsed, NotUsed2);
  /* IMP: R-52756-41993 This function is a wrapper around the
  ** sqlite3_total_changes() C/C++ interface. */
  sqlite3_result_int(context, sqlite3_total_changes(db));
}